

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O1

int32_t uloc_getKeywordValue_63
                  (char *localeID,char *keywordName,char *buffer,int32_t bufferCapacity,
                  UErrorCode *status)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  UBool UVar4;
  char cVar5;
  int32_t iVar6;
  int iVar7;
  uint uVar8;
  int32_t iVar9;
  char *pcVar10;
  char *pcVar11;
  char *__s;
  size_t sVar12;
  char *pcVar13;
  long lVar14;
  bool bVar15;
  char localeKeywordNameBuffer [25];
  char keywordNameBuffer [25];
  char tempBuffer [157];
  char local_118 [32];
  char local_f8 [32];
  char local_d8 [168];
  
  if (status == (UErrorCode *)0x0) {
    return 0;
  }
  if (localeID == (char *)0x0) {
    return 0;
  }
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  if ((keywordName == (char *)0x0) || (*keywordName == '\0')) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  else {
    locale_canonKeywordName(local_f8,keywordName,status);
    iVar9 = 0;
    bVar15 = false;
    if (U_ZERO_ERROR < *status) goto LAB_001b9d08;
    pcVar10 = strchr(localeID,0x40);
    pcVar11 = localeID;
    if ((pcVar10 == (char *)0x0) && (iVar6 = getShortestSubtagLength(localeID), iVar6 == 1)) {
      iVar6 = uloc_forLanguageTag_63(localeID,local_d8,0x9d,(int32_t *)0x0,status);
      if (((iVar6 < 1) ||
          (pcVar11 = local_d8, U_ZERO_ERROR < *status || *status == U_STRING_NOT_TERMINATED_WARNING)
          ) && (pcVar11 = localeID, *status == U_STRING_NOT_TERMINATED_WARNING)) {
        *status = U_BUFFER_OVERFLOW_ERROR;
      }
    }
    pcVar11 = strchr(pcVar11,0x40);
    if (pcVar11 != (char *)0x0) {
      do {
        bVar15 = pcVar11 == (char *)0x0;
        if (bVar15) break;
        __s = pcVar11 + 1;
        pcVar10 = strchr(__s,0x3d);
        if (pcVar10 == (char *)0x0) {
LAB_001b9cbf:
          *status = U_ILLEGAL_ARGUMENT_ERROR;
          iVar9 = 0;
LAB_001b9ceb:
          bVar1 = false;
        }
        else {
          do {
            pcVar13 = pcVar11 + 1;
            __s = pcVar11 + 1;
            pcVar3 = pcVar10;
            pcVar11 = __s;
          } while (*pcVar13 == ' ');
          do {
            pcVar11 = pcVar3;
            if (pcVar11 <= __s) break;
            pcVar3 = pcVar11 + -1;
          } while (pcVar11[-1] == ' ');
          if (pcVar11 == __s) {
            *status = U_ILLEGAL_ARGUMENT_ERROR;
LAB_001b9ce5:
            iVar9 = 0;
            goto LAB_001b9ceb;
          }
          if (__s < pcVar11) {
            lVar14 = 0;
            do {
              UVar4 = uprv_isASCIILetter_63(__s[lVar14]);
              if ((UVar4 == '\0') && (9 < (byte)(__s[lVar14] - 0x30U))) {
                *status = U_ILLEGAL_ARGUMENT_ERROR;
LAB_001b9ce2:
                __s = __s + lVar14;
                goto LAB_001b9ce5;
              }
              if (lVar14 == 0x18) {
                *status = U_INTERNAL_PROGRAM_ERROR;
                goto LAB_001b9ce2;
              }
              pcVar13 = __s + lVar14;
              cVar5 = uprv_asciitolower_63(*pcVar13);
              local_118[lVar14] = cVar5;
              lVar14 = lVar14 + 1;
            } while (pcVar13 + 1 < pcVar11);
          }
          else {
            lVar14 = 0;
          }
          local_118[lVar14] = '\0';
          __s = strchr(pcVar10,0x3b);
          iVar7 = strcmp(local_f8,local_118);
          bVar1 = true;
          if (iVar7 == 0) {
            do {
              pcVar11 = pcVar10 + 1;
              pcVar10 = pcVar10 + 1;
            } while (*pcVar11 == ' ');
            pcVar11 = __s;
            if (__s == (char *)0x0) {
              sVar12 = strlen(pcVar10);
              pcVar11 = pcVar10 + sVar12;
            }
            do {
              pcVar13 = pcVar11;
              if (pcVar13 <= pcVar10) break;
              pcVar11 = pcVar13 + -1;
            } while (pcVar13[-1] == ' ');
            if (pcVar13 == pcVar10) goto LAB_001b9cbf;
            lVar14 = 0;
            if (pcVar10 < pcVar13) {
              lVar14 = 0;
              do {
                UVar4 = uprv_isASCIILetter_63(pcVar10[lVar14]);
                if (((UVar4 == '\0') && (9 < (byte)(pcVar10[lVar14] - 0x30U))) &&
                   ((uVar8 = (byte)pcVar10[lVar14] - 0x2b, 0x34 < uVar8 ||
                    ((0x10000000000015U >> ((ulong)uVar8 & 0x3f) & 1) == 0)))) goto LAB_001b9cbf;
                if (lVar14 < bufferCapacity) {
                  buffer[lVar14] = pcVar10[lVar14];
                }
                lVar2 = lVar14 + 1;
                lVar14 = lVar14 + 1;
              } while (pcVar10 + lVar2 < pcVar13);
            }
            iVar9 = u_terminateChars_63(buffer,bufferCapacity,(int32_t)lVar14,status);
            goto LAB_001b9ceb;
          }
        }
        pcVar11 = __s;
      } while (bVar1);
      goto LAB_001b9d08;
    }
  }
  iVar9 = 0;
  bVar15 = false;
LAB_001b9d08:
  if (bVar15) {
    return 0;
  }
  return iVar9;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_getKeywordValue(const char* localeID,
                     const char* keywordName,
                     char* buffer, int32_t bufferCapacity,
                     UErrorCode* status)
{
    const char* startSearchHere = NULL;
    const char* nextSeparator = NULL;
    char keywordNameBuffer[ULOC_KEYWORD_BUFFER_LEN];
    char localeKeywordNameBuffer[ULOC_KEYWORD_BUFFER_LEN];
    int32_t result = 0;

    if(status && U_SUCCESS(*status) && localeID) {
      char tempBuffer[ULOC_FULLNAME_CAPACITY];
      const char* tmpLocaleID;

      if (keywordName == NULL || keywordName[0] == 0) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
      }

      locale_canonKeywordName(keywordNameBuffer, keywordName, status);
      if(U_FAILURE(*status)) {
        return 0;
      }

      if (_hasBCP47Extension(localeID)) {
          _ConvertBCP47(tmpLocaleID, localeID, tempBuffer, sizeof(tempBuffer), status);
      } else {
          tmpLocaleID=localeID;
      }

      startSearchHere = locale_getKeywordsStart(tmpLocaleID);
      if(startSearchHere == NULL) {
          /* no keywords, return at once */
          return 0;
      }

      /* find the first keyword */
      while(startSearchHere) {
          const char* keyValueTail;
          int32_t keyValueLen;

          startSearchHere++; /* skip @ or ; */
          nextSeparator = uprv_strchr(startSearchHere, '=');
          if(!nextSeparator) {
              *status = U_ILLEGAL_ARGUMENT_ERROR; /* key must have =value */
              return 0;
          }
          /* strip leading & trailing spaces (TC decided to tolerate these) */
          while(*startSearchHere == ' ') {
              startSearchHere++;
          }
          keyValueTail = nextSeparator;
          while (keyValueTail > startSearchHere && *(keyValueTail-1) == ' ') {
              keyValueTail--;
          }
          /* now keyValueTail points to first char after the keyName */
          /* copy & normalize keyName from locale */
          if (startSearchHere == keyValueTail) {
              *status = U_ILLEGAL_ARGUMENT_ERROR; /* empty keyword name in passed-in locale */
              return 0;
          }
          keyValueLen = 0;
          while (startSearchHere < keyValueTail) {
            if (!UPRV_ISALPHANUM(*startSearchHere)) {
              *status = U_ILLEGAL_ARGUMENT_ERROR; /* malformed keyword name */
              return 0;
            }
            if (keyValueLen < ULOC_KEYWORD_BUFFER_LEN - 1) {
              localeKeywordNameBuffer[keyValueLen++] = uprv_tolower(*startSearchHere++);
            } else {
              /* keyword name too long for internal buffer */
              *status = U_INTERNAL_PROGRAM_ERROR;
              return 0;
            }
          }
          localeKeywordNameBuffer[keyValueLen] = 0; /* terminate */

          startSearchHere = uprv_strchr(nextSeparator, ';');

          if(uprv_strcmp(keywordNameBuffer, localeKeywordNameBuffer) == 0) {
               /* current entry matches the keyword. */
             nextSeparator++; /* skip '=' */
              /* First strip leading & trailing spaces (TC decided to tolerate these) */
              while(*nextSeparator == ' ') {
                nextSeparator++;
              }
              keyValueTail = (startSearchHere)? startSearchHere: nextSeparator + uprv_strlen(nextSeparator);
              while(keyValueTail > nextSeparator && *(keyValueTail-1) == ' ') {
                keyValueTail--;
              }
              /* Now copy the value, but check well-formedness */
              if (nextSeparator == keyValueTail) {
                *status = U_ILLEGAL_ARGUMENT_ERROR; /* empty key value name in passed-in locale */
                return 0;
              }
              keyValueLen = 0;
              while (nextSeparator < keyValueTail) {
                if (!UPRV_ISALPHANUM(*nextSeparator) && !UPRV_OK_VALUE_PUNCTUATION(*nextSeparator)) {
                  *status = U_ILLEGAL_ARGUMENT_ERROR; /* malformed key value */
                  return 0;
                }
                if (keyValueLen < bufferCapacity) {
                  /* Should we lowercase value to return here? Tests expect as-is. */
                  buffer[keyValueLen++] = *nextSeparator++;
                } else { /* keep advancing so we return correct length in case of overflow */
                  keyValueLen++;
                  nextSeparator++;
                }
              }
              result = u_terminateChars(buffer, bufferCapacity, keyValueLen, status);
              return result;
          }
      }
    }
    return 0;
}